

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void cpu_x86_load_seg_x86_64(CPUX86State *env,int seg_reg,int selector)

{
  int iVar1;
  int dpl;
  int selector_local;
  int seg_reg_local;
  CPUX86State *env_local;
  
  if (((env->cr[0] & 1) == 0) || ((env->eflags & 0x20000) != 0)) {
    iVar1 = 0;
    if ((env->eflags & 0x20000) != 0) {
      iVar1 = 3;
    }
    cpu_x86_load_seg_cache
              (env,seg_reg,selector & 0xffffU,(long)(int)((selector & 0xffffU) << 4),0xffff,
               iVar1 << 0xd | 0x9300);
  }
  else {
    helper_load_seg_x86_64(env,seg_reg,selector);
  }
  return;
}

Assistant:

void cpu_x86_load_seg(CPUX86State *env, int seg_reg, int selector)
{
    if (!(env->cr[0] & CR0_PE_MASK) || (env->eflags & VM_MASK)) {
        int dpl = (env->eflags & VM_MASK) ? 3 : 0;
        selector &= 0xffff;
        cpu_x86_load_seg_cache(env, seg_reg, selector,
                               (selector << 4), 0xffff,
                               DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                               DESC_A_MASK | (dpl << DESC_DPL_SHIFT));
    } else {
        helper_load_seg(env, seg_reg, selector);
    }
}